

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaTime GetStreamTime(PaStream *s)

{
  snd_pcm_t *psVar1;
  long lVar2;
  size_t sVar3;
  size_t __n;
  undefined8 uStack_40;
  size_t local_38;
  size_t __alsa_alloca_size;
  snd_pcm_status_t *status;
  snd_timestamp_t timestamp;
  PaAlsaStream *stream;
  PaStream *s_local;
  
  uStack_40 = 0x113e9d;
  timestamp.tv_usec = (__suseconds_t)s;
  __n = (*(code *)alsa_snd_pcm_status_sizeof)();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  local_38 = __n;
  __alsa_alloca_size = (size_t)((long)&local_38 + lVar2);
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x113ec9;
  memset((void *)((long)&local_38 + lVar2),0,__n);
  sVar3 = __alsa_alloca_size;
  if (*(long *)(timestamp.tv_usec + 0x2c0) == 0) {
    if (*(long *)(timestamp.tv_usec + 0x340) != 0) {
      psVar1 = *(snd_pcm_t **)(timestamp.tv_usec + 0x340);
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x113f17;
      (*alsa_snd_pcm_status)(psVar1,(snd_pcm_status_t *)sVar3);
    }
  }
  else {
    psVar1 = *(snd_pcm_t **)(timestamp.tv_usec + 0x2c0);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x113eef;
    (*alsa_snd_pcm_status)(psVar1,(snd_pcm_status_t *)sVar3);
  }
  sVar3 = __alsa_alloca_size;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x113f2a;
  (*(code *)alsa_snd_pcm_status_get_tstamp)(sVar3,&status);
  return (double)(long)status + (double)timestamp.tv_sec / 1000000.0;
}

Assistant:

static PaTime GetStreamTime( PaStream *s )
{
    PaAlsaStream *stream = (PaAlsaStream*)s;

    snd_timestamp_t timestamp;
    snd_pcm_status_t* status;
    alsa_snd_pcm_status_alloca( &status );

    /* TODO: what if we have both?  does it really matter? */

    /* TODO: if running in callback mode, this will mean
     * libasound routines are being called from multiple threads.
     * need to verify that libasound is thread-safe. */

    if( stream->capture.pcm )
    {
        alsa_snd_pcm_status( stream->capture.pcm, status );
    }
    else if( stream->playback.pcm )
    {
        alsa_snd_pcm_status( stream->playback.pcm, status );
    }

    alsa_snd_pcm_status_get_tstamp( status, &timestamp );
    return timestamp.tv_sec + (PaTime)timestamp.tv_usec / 1e6;
}